

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall vmips::la::output(la *this,ostream *out)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  element_type *reg;
  element_type *peVar3;
  ostream *out_local;
  la *this_local;
  
  iVar1 = (*(this->super_Unary).super_Instruction._vptr_Instruction[1])();
  poVar2 = std::operator<<(out,(char *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2," ");
  reg = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  &(this->super_Unary).target);
  poVar2 = operator<<(poVar2,reg);
  poVar2 = std::operator<<(poVar2,", ");
  peVar3 = std::__shared_ptr_access<vmips::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->data);
  std::operator<<(poVar2,(string *)&peVar3->name);
  return;
}

Assistant:

void la::output(std::ostream &out) const {
    out << name() << " " << *this->target << ", " << data->name;
}